

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O1

void __thiscall
duckdb::ColumnData::InitializePrefetch
          (ColumnData *this,PrefetchState *prefetch_state,ColumnScanState *scan_state,
          idx_t remaining)

{
  ColumnSegment *this_00;
  ColumnScanState *extraout_RDX;
  ColumnScanState *extraout_RDX_00;
  ColumnScanState *pCVar1;
  ulong uVar2;
  idx_t iVar3;
  ColumnSegment *this_01;
  bool bVar4;
  
  this_01 = scan_state->current;
  if (this_01 != (ColumnSegment *)0x0) {
    pCVar1 = scan_state;
    if (scan_state->initialized == false) {
      ColumnSegment::InitializePrefetch(this_01,prefetch_state,scan_state);
      pCVar1 = extraout_RDX;
    }
    iVar3 = scan_state->row_index;
    do {
      if (remaining == 0) {
        return;
      }
      uVar2 = ((this_01->super_SegmentBase<duckdb::ColumnSegment>).start - iVar3) +
              (this_01->super_SegmentBase<duckdb::ColumnSegment>).count.
              super___atomic_base<unsigned_long>._M_i;
      if (remaining < uVar2) {
        uVar2 = remaining;
      }
      remaining = remaining - uVar2;
      if (remaining == 0) {
        bVar4 = true;
      }
      else {
        this_00 = (this_01->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p;
        bVar4 = this_00 != (ColumnSegment *)0x0;
        if (bVar4) {
          ColumnSegment::InitializePrefetch(this_00,prefetch_state,pCVar1);
          pCVar1 = extraout_RDX_00;
          this_01 = this_00;
        }
      }
      iVar3 = iVar3 + uVar2;
    } while (bVar4);
  }
  return;
}

Assistant:

void ColumnData::InitializePrefetch(PrefetchState &prefetch_state, ColumnScanState &scan_state, idx_t remaining) {
	auto current_segment = scan_state.current;
	if (!current_segment) {
		return;
	}
	if (!scan_state.initialized) {
		// need to prefetch for the current segment if we have not yet initialized the scan for this segment
		scan_state.current->InitializePrefetch(prefetch_state, scan_state);
	}
	idx_t row_index = scan_state.row_index;
	while (remaining > 0) {
		idx_t scan_count = MinValue<idx_t>(remaining, current_segment->start + current_segment->count - row_index);
		remaining -= scan_count;
		row_index += scan_count;
		if (remaining > 0) {
			auto next = data.GetNextSegment(current_segment);
			if (!next) {
				break;
			}
			next->InitializePrefetch(prefetch_state, scan_state);
			current_segment = next;
		}
	}
}